

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

tcache_t * tcache_create_explicit(tsd_t *tsd)

{
  ulong *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  arena_t *paVar6;
  ulong uVar7;
  long lVar8;
  undefined8 uVar9;
  tsd_t *tsd_00;
  ulong uVar10;
  rtree_leaf_elm_t *prVar11;
  atomic_p_t aVar12;
  uint uVar13;
  rtree_leaf_elm_t *extraout_RDX;
  rtree_leaf_elm_t *extraout_RDX_00;
  rtree_leaf_elm_t *extraout_RDX_01;
  rtree_leaf_elm_t *extraout_RDX_02;
  rtree_leaf_elm_t *avail_stack;
  rtree_leaf_elm_t *extraout_RDX_03;
  ulong uVar14;
  size_t usize;
  rtree_ctx_t *prVar15;
  rtree_ctx_t local_1b0;
  
  if ((ulong)stack_nelms < 0x438) {
    uVar13 = stack_nelms * 8 + 0x1687 & 0x7fc0;
    if (uVar13 < 0x1001) {
      usize = sz_index2size_tab[sz_size2index_tab[uVar13 >> 3]];
    }
    else {
      uVar10 = (ulong)uVar13 * 2 - 1;
      lVar8 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      uVar10 = ~(-1L << ((char)lVar8 - 3U & 0x3f));
      if ((uint)lVar8 < 7) {
        uVar10 = 0xf;
      }
      usize = ~uVar10 & uVar10 + uVar13;
    }
    if (0x3fff < usize) {
LAB_00114f88:
      usize = 0x4000;
    }
  }
  else {
    if (stack_nelms < 0x538) goto LAB_00114f88;
    uVar10 = (ulong)stack_nelms * 8 + 0x1648;
    uVar14 = uVar10 * 2 - 1;
    lVar8 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    uVar14 = ~(-1L << ((char)lVar8 - 3U & 0x3f));
    if ((uint)lVar8 < 7) {
      uVar14 = 0xf;
    }
    usize = ~uVar14 & uVar14 + uVar10;
    if (usize < uVar10) {
      usize = 0;
    }
    else if (0xffffffffffffefff < usize) {
      usize = 0;
    }
  }
  aVar12.repr = arenas[0].repr;
  if (arenas[0].repr == (void *)0x0) {
    aVar12.repr = arena_init((tsdn_t *)0x0,0,&extent_hooks_default);
  }
  tsd_00 = (tsd_t *)arena_palloc((tsdn_t *)tsd,(arena_t *)aVar12.repr,usize,0x40,true,
                                 (tcache_t *)0x0);
  if (tsd_00 == (tsd_t *)0x0) {
    return (tcache_t *)0x0;
  }
  if (tsd == (tsd_t *)0x0) {
    prVar15 = &local_1b0;
    rtree_ctx_data_init(prVar15);
    avail_stack = extraout_RDX_00;
  }
  else {
    prVar15 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    avail_stack = extraout_RDX;
  }
  uVar13 = (uint)((ulong)tsd_00 >> 0x1e) & 0xf;
  uVar14 = (ulong)tsd_00 & 0xffffffffc0000000;
  uVar10 = (ulong)(uVar13 << 4);
  puVar1 = (ulong *)((long)&prVar15->cache[0].leafkey + uVar10);
  uVar10 = *(ulong *)((long)&prVar15->cache[0].leafkey + uVar10);
  if (uVar10 == uVar14) {
    prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (prVar15->l2_cache[0].leafkey == uVar14) {
    avail_stack = prVar15->l2_cache[0].leaf;
    prVar15->l2_cache[0].leafkey = uVar10;
    prVar15->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar14;
    puVar1[1] = (ulong)avail_stack;
    prVar11 = (rtree_leaf_elm_t *)
              ((long)&(avail_stack->le_bits).repr + (ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8));
  }
  else {
    avail_stack = (rtree_leaf_elm_t *)0x118;
    do {
      if (*(ulong *)((long)&prVar15[-1].l2_cache[7].leaf + (long)avail_stack) == uVar14) {
        uVar7 = *(ulong *)((long)&prVar15->cache[0].leafkey + (long)&(avail_stack->le_bits).repr);
        puVar3 = (undefined8 *)((long)&prVar15[-1].l2_cache[6].leaf + (long)avail_stack);
        uVar9 = puVar3[1];
        puVar4 = (undefined8 *)((long)&prVar15[-1].l2_cache[7].leaf + (long)avail_stack);
        *puVar4 = *puVar3;
        puVar4[1] = uVar9;
        *(ulong *)((long)&prVar15[-1].l2_cache[6].leaf + (long)avail_stack) = uVar10;
        *(ulong *)((long)&(avail_stack->le_bits).repr + (long)&prVar15[-1].l2_cache[7].leafkey) =
             puVar1[1];
        *puVar1 = uVar14;
        puVar1[1] = uVar7;
        prVar11 = (rtree_leaf_elm_t *)(((uint)((ulong)tsd_00 >> 9) & 0x1ffff8) + uVar7);
        goto LAB_00115009;
      }
      avail_stack = avail_stack + 2;
    } while (avail_stack != (rtree_leaf_elm_t *)0x188);
    prVar11 = rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&extents_rtree,prVar15,(uintptr_t)tsd_00,true,false);
    avail_stack = extraout_RDX_02;
  }
LAB_00115009:
  pvVar5 = arenas[*(uint *)(((long)(prVar11->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe) &
                  0xfff].repr;
  if (tsd == (tsd_t *)0x0) {
    prVar15 = &local_1b0;
    rtree_ctx_data_init(prVar15);
    avail_stack = extraout_RDX_01;
  }
  else {
    prVar15 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar10 = (ulong)(uVar13 << 4);
  puVar1 = (ulong *)((long)&prVar15->cache[0].leafkey + uVar10);
  uVar10 = *(ulong *)((long)&prVar15->cache[0].leafkey + uVar10);
  if (uVar10 == uVar14) {
    prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (prVar15->l2_cache[0].leafkey == uVar14) {
    avail_stack = prVar15->l2_cache[0].leaf;
    prVar15->l2_cache[0].leafkey = uVar10;
    prVar15->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar14;
    puVar1[1] = (ulong)avail_stack;
    prVar11 = (rtree_leaf_elm_t *)
              ((long)&(avail_stack->le_bits).repr + (ulong)((uint)((ulong)tsd_00 >> 9) & 0x1ffff8));
  }
  else {
    avail_stack = (rtree_leaf_elm_t *)0x118;
    do {
      if (*(ulong *)((long)&prVar15[-1].l2_cache[7].leaf + (long)avail_stack) == uVar14) {
        uVar7 = *(ulong *)((long)&prVar15->cache[0].leafkey + (long)&(avail_stack->le_bits).repr);
        puVar3 = (undefined8 *)((long)&prVar15[-1].l2_cache[6].leaf + (long)avail_stack);
        uVar9 = puVar3[1];
        puVar4 = (undefined8 *)((long)&prVar15[-1].l2_cache[7].leaf + (long)avail_stack);
        *puVar4 = *puVar3;
        puVar4[1] = uVar9;
        *(ulong *)((long)&prVar15[-1].l2_cache[6].leaf + (long)avail_stack) = uVar10;
        *(ulong *)((long)&(avail_stack->le_bits).repr + (long)&prVar15[-1].l2_cache[7].leafkey) =
             puVar1[1];
        *puVar1 = uVar14;
        puVar1[1] = uVar7;
        prVar11 = (rtree_leaf_elm_t *)(((uint)((ulong)tsd_00 >> 9) & 0x1ffff8) + uVar7);
        goto LAB_00115053;
      }
      avail_stack = avail_stack + 2;
    } while (avail_stack != (rtree_leaf_elm_t *)0x188);
    prVar11 = rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&extents_rtree,prVar15,(uintptr_t)tsd_00,true,false);
    avail_stack = extraout_RDX_03;
  }
LAB_00115053:
  LOCK();
  plVar2 = (long *)((long)pvVar5 + 0x68);
  *plVar2 = *plVar2 + sz_index2size_tab[(ulong)(prVar11->le_bits).repr >> 0x30];
  UNLOCK();
  tcache_init(tsd_00,(tcache_t *)
                     &(tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).
                      bins_large[0xaf].tstats,avail_stack);
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
    aVar12.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
    if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0) &&
       (aVar12.repr = arena_choose_hard(tsd,true),
       tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) {
      paVar6 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).arena;
      if (paVar6 != (arena_t *)0x0) {
        if (paVar6 == (arena_t *)aVar12.repr) goto LAB_00115097;
        tcache_arena_dissociate
                  ((tsdn_t *)tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache)
        ;
      }
      tcache_arena_associate
                ((tsdn_t *)tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                 (arena_t *)aVar12.repr);
    }
  }
  else {
    aVar12 = arenas[0];
    if (arenas[0].repr == (void *)0x0) {
      aVar12.repr = arena_init((tsdn_t *)tsd,0,&extent_hooks_default);
    }
  }
LAB_00115097:
  tcache_arena_associate((tsdn_t *)tsd,(tcache_t *)tsd_00,(arena_t *)aVar12.repr);
  return (tcache_t *)tsd_00;
}

Assistant:

tcache_t *
tcache_create_explicit(tsd_t *tsd) {
	tcache_t *tcache;
	size_t size, stack_offset;

	size = sizeof(tcache_t);
	/* Naturally align the pointer stacks. */
	size = PTR_CEILING(size);
	stack_offset = size;
	size += stack_nelms * sizeof(void *);
	/* Avoid false cacheline sharing. */
	size = sz_sa2u(size, CACHELINE);

	tcache = ipallocztm(tsd_tsdn(tsd), size, CACHELINE, true, NULL, true,
	    arena_get(TSDN_NULL, 0, true));
	if (tcache == NULL) {
		return NULL;
	}

	tcache_init(tsd, tcache,
	    (void *)((uintptr_t)tcache + (uintptr_t)stack_offset));
	tcache_arena_associate(tsd_tsdn(tsd), tcache, arena_ichoose(tsd, NULL));

	return tcache;
}